

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::CommonCore::receiveAny
          (CommonCore *this,LocalFederateId federateID,InterfaceHandle *endpoint_id)

{
  FederateStates FVar1;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  undefined4 *in_RCX;
  undefined4 in_register_00000034;
  string_view message;
  
  this_00 = getFederateAt((CommonCore *)CONCAT44(in_register_00000034,federateID.fid),
                          (LocalFederateId)(BaseType)endpoint_id);
  if (this_00 != (FederateState *)0x0) {
    FVar1 = FederateState::getState(this_00);
    if (FVar1 == CREATED) {
      *in_RCX = 0x9aac0f00;
      (this->super_Core)._vptr_Core = (_func_int **)0x0;
    }
    else {
      FederateState::receiveAny((FederateState *)this,(InterfaceHandle *)this_00);
    }
    return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
           (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
  }
  this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "FederateID is not valid (receiveAny)";
  message._M_len = 0x24;
  InvalidIdentifier::InvalidIdentifier(this_01,message);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

std::unique_ptr<Message> CommonCore::receiveAny(LocalFederateId federateID,
                                                InterfaceHandle& endpoint_id)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("FederateID is not valid (receiveAny)"));
    }
    if (fed->getState() == FederateStates::CREATED) {
        endpoint_id = InterfaceHandle();
        return nullptr;
    }
    return fed->receiveAny(endpoint_id);
}